

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O3

void pzshape::TPZShapeTriang::ShapeCorner
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  
  pdVar1 = pt->fStore;
  lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar2 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3 = phi->fElem;
  *pdVar3 = (1.0 - *pdVar1) - pdVar1[1];
  if ((lVar2 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[1] = *pdVar1;
  if ((lVar2 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar3[2] = pdVar1[1];
  lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1 = dphi->fElem;
  *pdVar1 = -1.0;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1[1] = -1.0;
  if ((lVar2 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1[lVar2] = 1.0;
  if ((lVar2 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pdVar1[lVar2 + 1] = 0.0;
  if ((0 < lVar2) && (2 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    pdVar1[lVar2 * 2] = 0.0;
    if ((1 < lVar2) && (2 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      pdVar1[lVar2 * 2 + 1] = 1.0;
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZShapeTriang::ShapeCorner(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
		
		phi(0,0) =  1.-pt[0]-pt[1];
		phi(1,0) =  pt[0];
		phi(2,0) =  pt[1];
		dphi(0,0) = -1.;
		dphi(1,0) = -1.;
		dphi(0,1) =  1.;
		dphi(1,1) =  0.;
		dphi(0,2) =  0.;
		dphi(1,2) =  1.;
	}